

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall QTreeViewPrivate::updateScrollBars(QTreeViewPrivate *this)

{
  QAbstractScrollArea *this_00;
  QWidgetData *pQVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QSize QVar6;
  Representation step;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint step_00;
  
  this_00 = *(QAbstractScrollArea **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  pQVar1 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->data;
  step.m_i = ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1;
  step_00 = ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1;
  if ((int)(step.m_i | step_00) < 0) {
    step.m_i = 0;
    step_00 = 0;
  }
  if (((this->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
     ((this->super_QAbstractItemViewPrivate).state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this->super_QAbstractItemViewPrivate);
    (**(code **)(**(long **)&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate
                             .super_QFramePrivate.super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  if ((this->viewItems).d.size == 0) {
    (**(code **)(*(long *)this_00 + 0x220))(this_00);
  }
  if (this->uniformRowHeights == true) {
    if (this->defaultItemHeight < 1) {
      iVar4 = (int)(this->viewItems).d.size;
    }
    else {
      iVar4 = (int)step_00 / this->defaultItemHeight;
    }
  }
  else {
    iVar7 = (int)(this->viewItems).d.size;
    if (iVar7 < 1) {
      iVar4 = 0;
    }
    else {
      iVar5 = 0;
      iVar8 = 0;
      iVar3 = iVar7;
      do {
        iVar3 = iVar3 + -1;
        iVar4 = itemHeight(this,iVar3);
        iVar5 = iVar4 + iVar5;
        iVar4 = iVar8;
        if ((int)step_00 < iVar5) break;
        iVar8 = iVar8 + 1;
        iVar4 = iVar7;
      } while (iVar3 != 0);
    }
  }
  if ((this->super_QAbstractItemViewPrivate).verticalScrollMode == ScrollPerItem) {
    lVar2 = (this->viewItems).d.size;
    iVar7 = 1;
    if (1 < iVar4) {
      iVar7 = iVar4;
    }
    if (lVar2 == 0) {
      iVar7 = iVar4;
    }
    QAbstractSlider::setRange
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                super_QAbstractSlider,0,(int)lVar2 - iVar7);
    QAbstractSlider::setPageStep
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                super_QAbstractSlider,iVar7);
    QAbstractSlider::setSingleStep
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                super_QAbstractSlider,1);
  }
  else {
    if (this->uniformRowHeights == false) {
      if ((this->viewItems).d.size == 0) {
        iVar7 = 0;
      }
      else {
        uVar9 = 0;
        iVar7 = 0;
        do {
          iVar3 = itemHeight(this,(int)uVar9);
          iVar7 = iVar7 + iVar3;
          uVar9 = uVar9 + 1;
        } while (uVar9 < (ulong)(this->viewItems).d.size);
      }
    }
    else {
      iVar7 = this->defaultItemHeight * (int)(this->viewItems).d.size;
    }
    QAbstractSlider::setRange
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                super_QAbstractSlider,0,iVar7 - step_00);
    QAbstractSlider::setPageStep
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                super_QAbstractSlider,step_00);
    iVar4 = (int)step_00 / (iVar4 + 1);
    iVar7 = 2;
    if (2 < iVar4) {
      iVar7 = iVar4;
    }
    QAbstractSliderPrivate::itemviewChangeSingleStep
              (*(QAbstractSliderPrivate **)
                &(((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                 super_QAbstractSlider).super_QWidget.field_0x8,iVar7);
  }
  iVar7 = QHeaderView::count(this->header);
  if (iVar7 < 1) {
    iVar4 = 0;
  }
  else {
    iVar5 = 0;
    iVar8 = 0;
    iVar3 = iVar7;
    do {
      iVar3 = iVar3 + -1;
      iVar4 = QHeaderView::logicalIndex(this->header,iVar3);
      iVar4 = QHeaderView::sectionSize(this->header,iVar4);
      iVar5 = iVar4 + iVar5;
      iVar4 = iVar8;
      if (step.m_i < iVar5) break;
      iVar8 = iVar8 + 1;
      iVar4 = iVar7;
    } while (iVar3 != 0);
  }
  iVar3 = iVar4 + (uint)(iVar4 == 0);
  if (iVar7 < 1) {
    iVar3 = iVar4;
  }
  if ((this->super_QAbstractItemViewPrivate).horizontalScrollMode != ScrollPerItem) {
    iVar7 = QHeaderView::length(this->header);
    QVar6 = QAbstractScrollArea::maximumViewportSize(this_00);
    if ((iVar7 <= QVar6.wd.m_i.m_i) &&
       (iVar4 = QAbstractSlider::maximum
                          (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate
                            .vbar)->super_QAbstractSlider), iVar4 < 1)) {
      step.m_i = QVar6.wd.m_i.m_i;
    }
    QAbstractSlider::setPageStep
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
                super_QAbstractSlider,step.m_i);
    iVar7 = iVar7 - step.m_i;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    QAbstractSlider::setRange
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
                super_QAbstractSlider,0,iVar7);
    iVar4 = step.m_i / (iVar3 + 1);
    iVar7 = 2;
    if (2 < iVar4) {
      iVar7 = iVar4;
    }
    QAbstractSliderPrivate::itemviewChangeSingleStep
              (*(QAbstractSliderPrivate **)
                &(((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
                 super_QAbstractSlider).super_QWidget.field_0x8,iVar7);
    return;
  }
  QAbstractSlider::setRange
            (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
              super_QAbstractSlider,0,iVar7 - iVar3);
  QAbstractSlider::setPageStep
            (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
              super_QAbstractSlider,iVar3);
  QAbstractSlider::setSingleStep
            (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
              super_QAbstractSlider,1);
  return;
}

Assistant:

void QTreeViewPrivate::updateScrollBars()
{
    Q_Q(QTreeView);
    QSize viewportSize = viewport->size();
    if (!viewportSize.isValid())
        viewportSize = QSize(0, 0);

    executePostedLayout();
    if (viewItems.isEmpty()) {
        q->doItemsLayout();
    }

    int itemsInViewport = 0;
    if (uniformRowHeights) {
        if (defaultItemHeight <= 0)
            itemsInViewport = viewItems.size();
        else
            itemsInViewport = viewportSize.height() / defaultItemHeight;
    } else {
        const int itemsCount = viewItems.size();
        const int viewportHeight = viewportSize.height();
        for (int height = 0, item = itemsCount - 1; item >= 0; --item) {
            height += itemHeight(item);
            if (height > viewportHeight)
                break;
            ++itemsInViewport;
        }
    }
    if (verticalScrollMode == QAbstractItemView::ScrollPerItem) {
        if (!viewItems.isEmpty())
            itemsInViewport = qMax(1, itemsInViewport);
        vbar->setRange(0, viewItems.size() - itemsInViewport);
        vbar->setPageStep(itemsInViewport);
        vbar->setSingleStep(1);
    } else { // scroll per pixel
        int contentsHeight = 0;
        if (uniformRowHeights) {
            contentsHeight = defaultItemHeight * viewItems.size();
        } else { // ### (maybe do like QHeaderView by letting items have startposition)
            for (int i = 0; i < viewItems.size(); ++i)
                contentsHeight += itemHeight(i);
        }
        vbar->setRange(0, contentsHeight - viewportSize.height());
        vbar->setPageStep(viewportSize.height());
        vbar->d_func()->itemviewChangeSingleStep(qMax(viewportSize.height() / (itemsInViewport + 1), 2));
    }

    const int columnCount = header->count();
    const int viewportWidth = viewportSize.width();
    int columnsInViewport = 0;
    for (int width = 0, column = columnCount - 1; column >= 0; --column) {
        int logical = header->logicalIndex(column);
        width += header->sectionSize(logical);
        if (width > viewportWidth)
            break;
        ++columnsInViewport;
    }
    if (columnCount > 0)
        columnsInViewport = qMax(1, columnsInViewport);
    if (horizontalScrollMode == QAbstractItemView::ScrollPerItem) {
        hbar->setRange(0, columnCount - columnsInViewport);
        hbar->setPageStep(columnsInViewport);
        hbar->setSingleStep(1);
    } else { // scroll per pixel
        const int horizontalLength = header->length();
        const QSize maxSize = q->maximumViewportSize();
        if (maxSize.width() >= horizontalLength && vbar->maximum() <= 0)
            viewportSize = maxSize;
        hbar->setPageStep(viewportSize.width());
        hbar->setRange(0, qMax(horizontalLength - viewportSize.width(), 0));
        hbar->d_func()->itemviewChangeSingleStep(qMax(viewportSize.width() / (columnsInViewport + 1), 2));
    }
}